

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O3

void __thiscall
wabt::interp::RefPtr<wabt::interp::Extern>::RefPtr
          (RefPtr<wabt::interp::Extern> *this,Store *store,Ref ref)

{
  bool bVar1;
  Index IVar2;
  unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_> *puVar3;
  Ref local_20;
  
  bVar1 = Store::Is<wabt::interp::Extern>(store,ref);
  if (bVar1) {
    local_20.index = ref.index;
    IVar2 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
    this->root_index_ = IVar2;
    puVar3 = FreeList<std::unique_ptr<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>_>
             ::Get(&store->objects_,ref.index);
    this->obj_ = (Extern *)
                 (puVar3->_M_t).
                 super___uniq_ptr_impl<wabt::interp::Object,_std::default_delete<wabt::interp::Object>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_wabt::interp::Object_*,_std::default_delete<wabt::interp::Object>_>
                 .super__Head_base<0UL,_wabt::interp::Object_*,_false>._M_head_impl;
    this->store_ = store;
    return;
  }
  interp::RefPtr();
  return;
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index).get());
  store_ = &store;
}